

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall
inja::Parser::append_callback(Parser *this,Template *tmpl,string_view name,uint num_args)

{
  bool bVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Op local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  reference local_38;
  Bytecode *last;
  Template *pTStack_28;
  uint num_args_local;
  Template *tmpl_local;
  Parser *this_local;
  string_view name_local;
  
  name_local.data_ = (const_pointer)name.size_;
  this_local = (Parser *)name.data_;
  last._4_4_ = num_args;
  pTStack_28 = tmpl;
  tmpl_local = (Template *)this;
  bVar1 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::empty(&tmpl->bytecodes);
  if (((bVar1) ||
      (local_38 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                            (&pTStack_28->bytecodes), local_38->op != Push)) ||
     (*(uint *)&local_38->field_0x4 >> 0x1e != 1)) {
    local_59 = Callback;
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op,unsigned_int&>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)pTStack_28,&local_59,
               (uint *)((long)&last + 4));
    nonstd::sv_lite::basic_string_view::operator_cast_to_string
              (&local_80,(basic_string_view *)&this_local);
    pvVar2 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                       (&pTStack_28->bytecodes);
    std::__cxx11::string::operator=((string *)&pvVar2->str,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    local_38->op = Callback;
    *(uint *)&local_38->field_0x4 =
         *(uint *)&local_38->field_0x4 & 0xc0000000 | last._4_4_ & 0x3fffffff;
    nonstd::sv_lite::basic_string_view::operator_cast_to_string
              (&local_58,(basic_string_view *)&this_local);
    std::__cxx11::string::operator=((string *)&local_38->str,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void append_callback(Template& tmpl, nonstd::string_view name, unsigned int num_args) {
		// we can merge with back-to-back push value (not lookup)
		if (!tmpl.bytecodes.empty()) {
			Bytecode& last = tmpl.bytecodes.back();
			if (last.op == Bytecode::Op::Push &&
				(last.flags & Bytecode::Flag::ValueMask) == Bytecode::Flag::ValueImmediate) {
				last.op = Bytecode::Op::Callback;
				last.args = num_args;
				last.str = static_cast<std::string>(name);
				return;
			}
		}

		// otherwise just add it to the end
		tmpl.bytecodes.emplace_back(Bytecode::Op::Callback, num_args);
		tmpl.bytecodes.back().str = static_cast<std::string>(name);
	}